

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlChar * xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt)

{
  uint uVar1;
  undefined8 in_RAX;
  int code;
  xmlChar *pxVar2;
  uchar uVar3;
  xmlChar *cur;
  undefined4 uStack_38;
  int len;
  
  uVar3 = *ctxt->cur;
  _uStack_38 = in_RAX;
  if (uVar3 != '\"') {
    if (uVar3 != '\'') {
      code = 3;
      goto LAB_001bb0ed;
    }
    uVar3 = '\'';
  }
  cur = ctxt->cur + 1;
  ctxt->cur = cur;
  code = 2;
  pxVar2 = cur;
  while( true ) {
    if (uVar3 == *pxVar2) {
      pxVar2 = xmlStrndup(cur,(int)pxVar2 - (int)cur);
      if (pxVar2 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      return pxVar2;
    }
    _uStack_38 = CONCAT44(4,uStack_38);
    if (*pxVar2 == '\0') goto LAB_001bb0ed;
    uVar1 = xmlGetUTF8Char(pxVar2,&len);
    if ((int)uVar1 < 0) break;
    if (uVar1 < 0x100) {
      if (((0xd < (byte)uVar1) || ((0x2600U >> (uVar1 & 0x1f) & 1) == 0)) && (uVar1 < 0x20)) break;
    }
    else if (0xfffff < uVar1 - 0x10000 && (0x1ffd < uVar1 - 0xe000 && 0xd7ff < uVar1)) break;
    pxVar2 = ctxt->cur + len;
    ctxt->cur = pxVar2;
  }
  code = 0x15;
LAB_001bb0ed:
  xmlXPathErr(ctxt,code);
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt) {
    const xmlChar *q;
    xmlChar *ret = NULL;
    int quote;

    if (CUR == '"') {
        quote = '"';
    } else if (CUR == '\'') {
        quote = '\'';
    } else {
	XP_ERRORNULL(XPATH_START_LITERAL_ERROR);
    }

    NEXT;
    q = CUR_PTR;
    while (CUR != quote) {
        int ch;
        int len = 4;

        if (CUR == 0)
            XP_ERRORNULL(XPATH_UNFINISHED_LITERAL_ERROR);
        ch = xmlGetUTF8Char(CUR_PTR, &len);
        if ((ch < 0) || (IS_CHAR(ch) == 0))
            XP_ERRORNULL(XPATH_INVALID_CHAR_ERROR);
        CUR_PTR += len;
    }
    ret = xmlStrndup(q, CUR_PTR - q);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    NEXT;
    return(ret);
}